

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zetMetricStreamerReadData
          (zet_metric_streamer_handle_t hMetricStreamer,uint32_t maxReportCount,size_t *pRawDataSize
          ,uint8_t *pRawData)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ulong uVar7;
  ulong uVar8;
  ze_result_t unaff_R15D;
  bool bVar9;
  ze_result_t local_9c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zetMetricStreamerReadData(hMetricStreamer, maxReportCount, pRawDataSize, pRawData)",""
            );
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0x7c8);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar7 = lVar4 - lVar2 >> 3;
    bVar9 = lVar4 != lVar2;
    local_9c = unaff_R15D;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 0x10);
        local_9c = (**(code **)(*plVar5 + 0x170))
                             (plVar5,hMetricStreamer,maxReportCount,pRawDataSize,pRawData);
        if (local_9c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetMetricStreamerReadData",local_9c);
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
        local_9c = unaff_R15D;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return local_9c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZETHandleLifetimeValidation::zetMetricStreamerReadDataPrologue
                          ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                           hMetricStreamer,maxReportCount,pRawDataSize,pRawData),
       zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zetMetricStreamerReadData",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hMetricStreamer,maxReportCount,pRawDataSize,pRawData);
    bVar9 = lVar4 != lVar2;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 0x10);
        result = (**(code **)(*plVar5 + 0x178))
                           (plVar5,hMetricStreamer,maxReportCount,pRawDataSize,pRawData,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetMetricStreamerReadData",result);
          local_9c = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar2 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar9) {
      return local_9c;
    }
  }
  logAndPropagateResult("zetMetricStreamerReadData",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerReadData(
        zet_metric_streamer_handle_t hMetricStreamer,   ///< [in] handle of the metric streamer
        uint32_t maxReportCount,                        ///< [in] the maximum number of reports the application wants to receive.
                                                        ///< if `UINT32_MAX`, then function will retrieve all reports available
        size_t* pRawDataSize,                           ///< [in,out] pointer to size in bytes of raw data requested to read.
                                                        ///< if size is zero, then the driver will update the value with the total
                                                        ///< size in bytes needed for all reports available.
                                                        ///< if size is non-zero, then driver will only retrieve the number of
                                                        ///< reports that fit into the buffer.
                                                        ///< if size is larger than size needed for all reports, then driver will
                                                        ///< update the value with the actual size needed.
        uint8_t* pRawData                               ///< [in,out][optional][range(0, *pRawDataSize)] buffer containing streamer
                                                        ///< reports in raw format
        )
    {
        context.logger->log_trace("zetMetricStreamerReadData(hMetricStreamer, maxReportCount, pRawDataSize, pRawData)");

        auto pfnReadData = context.zetDdiTable.MetricStreamer.pfnReadData;

        if( nullptr == pfnReadData )
            return logAndPropagateResult("zetMetricStreamerReadData", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricStreamerReadDataPrologue( hMetricStreamer, maxReportCount, pRawDataSize, pRawData );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricStreamerReadData", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricStreamerReadDataPrologue( hMetricStreamer, maxReportCount, pRawDataSize, pRawData );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricStreamerReadData", result);
        }

        auto driver_result = pfnReadData( hMetricStreamer, maxReportCount, pRawDataSize, pRawData );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricStreamerReadDataEpilogue( hMetricStreamer, maxReportCount, pRawDataSize, pRawData ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricStreamerReadData", result);
        }

        return logAndPropagateResult("zetMetricStreamerReadData", driver_result);
    }